

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fdct32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  __m256i alVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  __m256i alVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  __m256i alVar96;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  __m256i alVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  __m256i alVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  __m256i alVar108;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  __m256i alVar112;
  undefined1 auVar113 [32];
  __m256i alVar114;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  __m256i alVar120;
  undefined1 auVar121 [32];
  __m256i alVar122;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  __m256i alVar125;
  undefined1 auVar126 [32];
  undefined1 local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [32];
  undefined1 local_528 [32];
  undefined1 local_508 [32];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [32];
  undefined1 local_488 [32];
  undefined1 local_468 [32];
  undefined1 local_448 [32];
  undefined1 local_428 [32];
  undefined1 local_408 [32];
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  undefined1 local_388 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  longlong local_2c8;
  longlong lStack_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  longlong local_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  longlong lStack_1a0;
  
  uVar4 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar7 = (long)(int)uVar4 * 0x100;
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1e0);
  iVar5 = -iVar8;
  auVar13 = vpsubd_avx2((undefined1  [32])input[instride * 4],
                        (undefined1  [32])input[instride * 0x1b]);
  auVar74 = vpsubd_avx2((undefined1  [32])input[instride * 0xb],
                        (undefined1  [32])input[instride * 0x14]);
  auVar94._4_4_ = iVar5;
  auVar94._0_4_ = iVar5;
  auVar94._8_4_ = iVar5;
  auVar94._12_4_ = iVar5;
  auVar94._16_4_ = iVar5;
  auVar94._20_4_ = iVar5;
  auVar94._24_4_ = iVar5;
  auVar94._28_4_ = iVar5;
  auVar109._4_4_ = iVar8;
  auVar109._0_4_ = iVar8;
  auVar109._8_4_ = iVar8;
  auVar109._12_4_ = iVar8;
  auVar109._16_4_ = iVar8;
  auVar109._20_4_ = iVar8;
  auVar109._24_4_ = iVar8;
  auVar109._28_4_ = iVar8;
  auVar86 = vpmulld_avx2(auVar94,auVar74);
  auVar12 = vpmulld_avx2(auVar109,auVar13);
  local_288 = vpaddd_avx2(auVar86,auVar12);
  uVar10 = -uVar4;
  auVar11 = ZEXT416(uVar4);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_288 = vpslld_avx2(local_288,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar86._4_4_ = iVar8;
    auVar86._0_4_ = iVar8;
    auVar86._8_4_ = iVar8;
    auVar86._12_4_ = iVar8;
    auVar86._16_4_ = iVar8;
    auVar86._20_4_ = iVar8;
    auVar86._24_4_ = iVar8;
    auVar86._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_288,auVar86);
    local_288 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar14 = vpsubd_avx2((undefined1  [32])input[instride * 5],
                        (undefined1  [32])input[instride * 0x1a]);
  auVar15 = vpsubd_avx2((undefined1  [32])input[instride * 10],
                        (undefined1  [32])input[instride * 0x15]);
  auVar86 = vpmulld_avx2(auVar109,auVar74);
  auVar12 = vpmulld_avx2(auVar94,auVar13);
  local_568 = vpsubd_avx2(auVar86,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_568 = vpslld_avx2(local_568,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar12._4_4_ = iVar8;
    auVar12._0_4_ = iVar8;
    auVar12._8_4_ = iVar8;
    auVar12._12_4_ = iVar8;
    auVar12._16_4_ = iVar8;
    auVar12._20_4_ = iVar8;
    auVar12._24_4_ = iVar8;
    auVar12._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_568,auVar12);
    local_568 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar86 = vpmulld_avx2(auVar94,auVar15);
  auVar12 = vpmulld_avx2(auVar109,auVar14);
  local_388 = vpaddd_avx2(auVar86,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_388 = vpslld_avx2(local_388,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar13._4_4_ = iVar8;
    auVar13._0_4_ = iVar8;
    auVar13._8_4_ = iVar8;
    auVar13._12_4_ = iVar8;
    auVar13._16_4_ = iVar8;
    auVar13._20_4_ = iVar8;
    auVar13._24_4_ = iVar8;
    auVar13._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_388,auVar13);
    local_388 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar13 = vpsubd_avx2((undefined1  [32])input[instride * 6],
                        (undefined1  [32])input[instride * 0x19]);
  auVar74 = vpsubd_avx2((undefined1  [32])input[instride * 9],
                        (undefined1  [32])input[instride * 0x16]);
  auVar86 = vpmulld_avx2(auVar109,auVar15);
  auVar12 = vpmulld_avx2(auVar94,auVar14);
  local_528 = vpsubd_avx2(auVar86,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_528 = vpslld_avx2(local_528,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar14._4_4_ = iVar8;
    auVar14._0_4_ = iVar8;
    auVar14._8_4_ = iVar8;
    auVar14._12_4_ = iVar8;
    auVar14._16_4_ = iVar8;
    auVar14._20_4_ = iVar8;
    auVar14._24_4_ = iVar8;
    auVar14._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_528,auVar14);
    local_528 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar86 = vpmulld_avx2(auVar94,auVar74);
  auVar12 = vpmulld_avx2(auVar109,auVar13);
  local_508 = vpaddd_avx2(auVar86,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_508 = vpslld_avx2(local_508,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar15._4_4_ = iVar8;
    auVar15._0_4_ = iVar8;
    auVar15._8_4_ = iVar8;
    auVar15._12_4_ = iVar8;
    auVar15._16_4_ = iVar8;
    auVar15._20_4_ = iVar8;
    auVar15._24_4_ = iVar8;
    auVar15._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_508,auVar15);
    local_508 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar14 = vpsubd_avx2((undefined1  [32])input[instride * 7],
                        (undefined1  [32])input[instride * 0x18]);
  auVar15 = vpsubd_avx2((undefined1  [32])input[instride * 8],
                        (undefined1  [32])input[instride * 0x17]);
  auVar86 = vpmulld_avx2(auVar109,auVar74);
  auVar12 = vpmulld_avx2(auVar94,auVar13);
  auVar86 = vpsubd_avx2(auVar86,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar86 = vpslld_avx2(auVar86,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar74._4_4_ = iVar8;
    auVar74._0_4_ = iVar8;
    auVar74._8_4_ = iVar8;
    auVar74._12_4_ = iVar8;
    auVar74._16_4_ = iVar8;
    auVar74._20_4_ = iVar8;
    auVar74._24_4_ = iVar8;
    auVar74._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(auVar86,auVar74);
    auVar86 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar12 = vpaddd_avx2((undefined1  [32])input[instride * 0x1d],
                        (undefined1  [32])input[instride * 2]);
  auVar13 = vpaddd_avx2((undefined1  [32])input[instride * 0x1a],
                        (undefined1  [32])input[instride * 5]);
  auVar74 = vpaddd_avx2((undefined1  [32])input[instride * 0x15],
                        (undefined1  [32])input[instride * 10]);
  auVar62 = vpaddd_avx2((undefined1  [32])input[instride * 0x12],
                        (undefined1  [32])input[instride * 0xd]);
  auVar37 = vpmulld_avx2(auVar94,auVar15);
  auVar18 = vpmulld_avx2(auVar109,auVar14);
  local_2e8 = vpaddd_avx2(auVar37,auVar18);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_2e8 = vpslld_avx2(local_2e8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar37._4_4_ = iVar8;
    auVar37._0_4_ = iVar8;
    auVar37._8_4_ = iVar8;
    auVar37._12_4_ = iVar8;
    auVar37._16_4_ = iVar8;
    auVar37._20_4_ = iVar8;
    auVar37._24_4_ = iVar8;
    auVar37._28_4_ = iVar8;
    auVar37 = vpaddd_avx2(local_2e8,auVar37);
    local_2e8 = vpsrad_avx2(auVar37,auVar11);
  }
  auVar37 = vpsubd_avx2(auVar12,auVar62);
  auVar18 = vpsubd_avx2(auVar13,auVar74);
  auVar15 = vpmulld_avx2(auVar109,auVar15);
  auVar14 = vpmulld_avx2(auVar94,auVar14);
  local_4e8 = vpsubd_avx2(auVar15,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4e8 = vpslld_avx2(local_4e8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar16._4_4_ = iVar8;
    auVar16._0_4_ = iVar8;
    auVar16._8_4_ = iVar8;
    auVar16._12_4_ = iVar8;
    auVar16._16_4_ = iVar8;
    auVar16._20_4_ = iVar8;
    auVar16._24_4_ = iVar8;
    auVar16._28_4_ = iVar8;
    auVar14 = vpaddd_avx2(local_4e8,auVar16);
    local_4e8 = vpsrad_avx2(auVar14,auVar11);
  }
  auVar26 = local_4e8;
  auVar14 = vpaddd_avx2((undefined1  [32])input[instride * 0x1c],
                        (undefined1  [32])input[instride * 3]);
  auVar15 = vpaddd_avx2((undefined1  [32])input[instride * 0x1b],
                        (undefined1  [32])input[instride * 4]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[instride * 0x14],
                        (undefined1  [32])input[instride * 0xb]);
  auVar44 = vpmulld_avx2(auVar94,auVar18);
  auVar17 = vpmulld_avx2(auVar109,auVar37);
  local_5a8 = vpaddd_avx2(auVar44,auVar17);
  auVar44 = vpaddd_avx2((undefined1  [32])input[instride * 0x13],
                        (undefined1  [32])input[instride * 0xc]);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_5a8 = vpslld_avx2(local_5a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar17._4_4_ = iVar8;
    auVar17._0_4_ = iVar8;
    auVar17._8_4_ = iVar8;
    auVar17._12_4_ = iVar8;
    auVar17._16_4_ = iVar8;
    auVar17._20_4_ = iVar8;
    auVar17._24_4_ = iVar8;
    auVar17._28_4_ = iVar8;
    auVar17 = vpaddd_avx2(local_5a8,auVar17);
    local_5a8 = vpsrad_avx2(auVar17,auVar11);
  }
  auVar17 = vpaddd_avx2((undefined1  [32])input[instride * 0x1e],(undefined1  [32])input[instride]);
  auVar113 = vpaddd_avx2((undefined1  [32])input[instride * 0x19],
                         (undefined1  [32])input[instride * 6]);
  auVar40 = vpaddd_avx2((undefined1  [32])input[instride * 0x16],
                        (undefined1  [32])input[instride * 9]);
  auVar41 = vpaddd_avx2((undefined1  [32])input[instride * 0x11],
                        (undefined1  [32])input[instride * 0xe]);
  auVar87 = vpsubd_avx2(auVar14,auVar44);
  auVar18 = vpmulld_avx2(auVar109,auVar18);
  auVar37 = vpmulld_avx2(auVar94,auVar37);
  local_4c8 = vpsubd_avx2(auVar18,auVar37);
  auVar37 = vpsubd_avx2(auVar15,auVar16);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4c8 = vpslld_avx2(local_4c8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar8;
    auVar18._12_4_ = iVar8;
    auVar18._16_4_ = iVar8;
    auVar18._20_4_ = iVar8;
    auVar18._24_4_ = iVar8;
    auVar18._28_4_ = iVar8;
    auVar18 = vpaddd_avx2(local_4c8,auVar18);
    local_4c8 = vpsrad_avx2(auVar18,auVar11);
  }
  auVar18 = vpaddd_avx2(auVar41,auVar17);
  auVar12 = vpaddd_avx2(auVar62,auVar12);
  auVar13 = vpaddd_avx2(auVar74,auVar13);
  auVar74 = vpaddd_avx2(auVar40,auVar113);
  auVar62 = vpmulld_avx2(auVar94,auVar37);
  auVar75 = vpmulld_avx2(auVar109,auVar87);
  auVar62 = vpaddd_avx2(auVar75,auVar62);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar62 = vpslld_avx2(auVar62,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar75._4_4_ = iVar8;
    auVar75._0_4_ = iVar8;
    auVar75._8_4_ = iVar8;
    auVar75._12_4_ = iVar8;
    auVar75._16_4_ = iVar8;
    auVar75._20_4_ = iVar8;
    auVar75._24_4_ = iVar8;
    auVar75._28_4_ = iVar8;
    auVar62 = vpaddd_avx2(auVar62,auVar75);
    auVar62 = vpsrad_avx2(auVar62,auVar11);
  }
  auVar75 = vpsubd_avx2(auVar18,auVar74);
  auVar76 = vpsubd_avx2(auVar12,auVar13);
  auVar37 = vpmulld_avx2(auVar109,auVar37);
  auVar87 = vpmulld_avx2(auVar94,auVar87);
  local_468 = vpsubd_avx2(auVar37,auVar87);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_468 = vpslld_avx2(local_468,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar87._4_4_ = iVar8;
    auVar87._0_4_ = iVar8;
    auVar87._8_4_ = iVar8;
    auVar87._12_4_ = iVar8;
    auVar87._16_4_ = iVar8;
    auVar87._20_4_ = iVar8;
    auVar87._24_4_ = iVar8;
    auVar87._28_4_ = iVar8;
    auVar37 = vpaddd_avx2(local_468,auVar87);
    local_468 = vpsrad_avx2(auVar37,auVar11);
  }
  auVar55 = vpsubd_avx2((undefined1  [32])input[instride * 2],
                        (undefined1  [32])input[instride * 0x1d]);
  auVar79 = vpsubd_avx2((undefined1  [32])input[instride * 0xd],
                        (undefined1  [32])input[instride * 0x12]);
  auVar37 = vpmulld_avx2(auVar94,auVar76);
  auVar87 = vpmulld_avx2(auVar109,auVar75);
  auVar37 = vpaddd_avx2(auVar37,auVar87);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar37 = vpslld_avx2(auVar37,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar88._4_4_ = iVar8;
    auVar88._0_4_ = iVar8;
    auVar88._8_4_ = iVar8;
    auVar88._12_4_ = iVar8;
    auVar88._16_4_ = iVar8;
    auVar88._20_4_ = iVar8;
    auVar88._24_4_ = iVar8;
    auVar88._28_4_ = iVar8;
    auVar37 = vpaddd_avx2(auVar37,auVar88);
    auVar37 = vpsrad_avx2(auVar37,auVar11);
  }
  auVar87 = vpaddd_avx2(auVar79,local_388);
  auVar88 = vpaddd_avx2(auVar55,local_528);
  auVar76 = vpmulld_avx2(auVar109,auVar76);
  auVar94 = vpmulld_avx2(auVar94,auVar75);
  local_1f8 = vpsubd_avx2(auVar76,auVar94);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_1f8 = vpslld_avx2(local_1f8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar76._4_4_ = iVar8;
    auVar76._0_4_ = iVar8;
    auVar76._8_4_ = iVar8;
    auVar76._12_4_ = iVar8;
    auVar76._16_4_ = iVar8;
    auVar76._20_4_ = iVar8;
    auVar76._24_4_ = iVar8;
    auVar76._28_4_ = iVar8;
    auVar94 = vpaddd_avx2(local_1f8,auVar76);
    local_1f8 = vpsrad_avx2(auVar94,auVar11);
  }
  auVar76 = vpsubd_avx2((undefined1  [32])input[instride * 3],
                        (undefined1  [32])input[instride * 0x1c]);
  auVar77 = vpsubd_avx2((undefined1  [32])input[instride * 0xc],
                        (undefined1  [32])input[instride * 0x13]);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1a0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x220);
  iVar3 = -iVar8;
  auVar89._4_4_ = iVar3;
  auVar89._0_4_ = iVar3;
  auVar89._8_4_ = iVar3;
  auVar89._12_4_ = iVar3;
  auVar89._16_4_ = iVar3;
  auVar89._20_4_ = iVar3;
  auVar89._24_4_ = iVar3;
  auVar89._28_4_ = iVar3;
  auVar106._4_4_ = iVar5;
  auVar106._0_4_ = iVar5;
  auVar106._8_4_ = iVar5;
  auVar106._12_4_ = iVar5;
  auVar106._16_4_ = iVar5;
  auVar106._20_4_ = iVar5;
  auVar106._24_4_ = iVar5;
  auVar106._28_4_ = iVar5;
  auVar94 = vpmulld_avx2(auVar89,auVar87);
  auVar75 = vpmulld_avx2(auVar106,auVar88);
  local_548 = vpaddd_avx2(auVar75,auVar94);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_548 = vpslld_avx2(local_548,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar69._4_4_ = iVar3;
    auVar69._0_4_ = iVar3;
    auVar69._8_4_ = iVar3;
    auVar69._12_4_ = iVar3;
    auVar69._16_4_ = iVar3;
    auVar69._20_4_ = iVar3;
    auVar69._24_4_ = iVar3;
    auVar69._28_4_ = iVar3;
    auVar94 = vpaddd_avx2(local_548,auVar69);
    local_548 = vpsrad_avx2(auVar94,auVar11);
  }
  auVar94 = vpaddd_avx2(auVar77,local_288);
  auVar75 = vpaddd_avx2(auVar76,local_568);
  auVar87 = vpmulld_avx2(auVar106,auVar87);
  auVar88 = vpmulld_avx2(auVar89,auVar88);
  local_4a8 = vpsubd_avx2(auVar87,auVar88);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4a8 = vpslld_avx2(local_4a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar70._4_4_ = iVar3;
    auVar70._0_4_ = iVar3;
    auVar70._8_4_ = iVar3;
    auVar70._12_4_ = iVar3;
    auVar70._16_4_ = iVar3;
    auVar70._20_4_ = iVar3;
    auVar70._24_4_ = iVar3;
    auVar70._28_4_ = iVar3;
    auVar87 = vpaddd_avx2(local_4a8,auVar70);
    local_4a8 = vpsrad_avx2(auVar87,auVar11);
  }
  auVar87 = vpmulld_avx2(auVar89,auVar94);
  auVar88 = vpmulld_avx2(auVar106,auVar75);
  local_588 = vpaddd_avx2(auVar88,auVar87);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_588 = vpslld_avx2(local_588,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar71._4_4_ = iVar3;
    auVar71._0_4_ = iVar3;
    auVar71._8_4_ = iVar3;
    auVar71._12_4_ = iVar3;
    auVar71._16_4_ = iVar3;
    auVar71._20_4_ = iVar3;
    auVar71._24_4_ = iVar3;
    auVar71._28_4_ = iVar3;
    auVar87 = vpaddd_avx2(local_588,auVar71);
    local_588 = vpsrad_avx2(auVar87,auVar11);
  }
  auVar88 = vpsubd_avx2(auVar77,local_288);
  auVar76 = vpsubd_avx2(auVar76,local_568);
  auVar94 = vpmulld_avx2(auVar106,auVar94);
  auVar87 = vpmulld_avx2(auVar89,auVar75);
  local_568 = vpsubd_avx2(auVar94,auVar87);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_568 = vpslld_avx2(local_568,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar77._4_4_ = iVar3;
    auVar77._0_4_ = iVar3;
    auVar77._8_4_ = iVar3;
    auVar77._12_4_ = iVar3;
    auVar77._16_4_ = iVar3;
    auVar77._20_4_ = iVar3;
    auVar77._24_4_ = iVar3;
    auVar77._28_4_ = iVar3;
    auVar94 = vpaddd_avx2(local_568,auVar77);
    local_568 = vpsrad_avx2(auVar94,auVar11);
  }
  auVar94 = vpaddd_avx2((undefined1  [32])input[instride * 0x1f],(undefined1  [32])*input);
  auVar87 = vpaddd_avx2((undefined1  [32])input[instride * 0x18],
                        (undefined1  [32])input[instride * 7]);
  auVar75 = vpaddd_avx2((undefined1  [32])input[instride * 0x17],
                        (undefined1  [32])input[instride * 8]);
  auVar77 = vpaddd_avx2((undefined1  [32])input[instride * 0xf],
                        (undefined1  [32])input[instride * 0x10]);
  iVar5 = -iVar5;
  auVar97._4_4_ = iVar5;
  auVar97._0_4_ = iVar5;
  auVar97._8_4_ = iVar5;
  auVar97._12_4_ = iVar5;
  auVar97._16_4_ = iVar5;
  auVar97._20_4_ = iVar5;
  auVar97._24_4_ = iVar5;
  auVar97._28_4_ = iVar5;
  auVar69 = vpmulld_avx2(auVar97,auVar88);
  auVar70 = vpmulld_avx2(auVar89,auVar76);
  auVar69 = vpaddd_avx2(auVar69,auVar70);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar69 = vpslld_avx2(auVar69,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar78._4_4_ = iVar5;
    auVar78._0_4_ = iVar5;
    auVar78._8_4_ = iVar5;
    auVar78._12_4_ = iVar5;
    auVar78._16_4_ = iVar5;
    auVar78._20_4_ = iVar5;
    auVar78._24_4_ = iVar5;
    auVar78._28_4_ = iVar5;
    auVar69 = vpaddd_avx2(auVar69,auVar78);
    auVar69 = vpsrad_avx2(auVar69,auVar11);
  }
  auVar14 = vpaddd_avx2(auVar44,auVar14);
  auVar15 = vpaddd_avx2(auVar16,auVar15);
  auVar79 = vpsubd_avx2(auVar79,local_388);
  auVar55 = vpsubd_avx2(auVar55,local_528);
  auVar16 = vpaddd_avx2(auVar94,auVar77);
  auVar44 = vpmulld_avx2(auVar89,auVar88);
  auVar76 = vpmulld_avx2(auVar97,auVar76);
  local_388 = vpsubd_avx2(auVar44,auVar76);
  auVar44 = vpaddd_avx2(auVar87,auVar75);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_388 = vpslld_avx2(local_388,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar38._4_4_ = iVar5;
    auVar38._0_4_ = iVar5;
    auVar38._8_4_ = iVar5;
    auVar38._12_4_ = iVar5;
    auVar38._16_4_ = iVar5;
    auVar38._20_4_ = iVar5;
    auVar38._24_4_ = iVar5;
    auVar38._28_4_ = iVar5;
    auVar76 = vpaddd_avx2(local_388,auVar38);
    local_388 = vpsrad_avx2(auVar76,auVar11);
  }
  auVar76 = vpaddd_avx2(auVar16,auVar44);
  auVar74 = vpaddd_avx2(auVar74,auVar18);
  auVar12 = vpaddd_avx2(auVar13,auVar12);
  auVar13 = vpaddd_avx2(auVar15,auVar14);
  auVar18 = vpmulld_avx2(auVar97,auVar79);
  auVar88 = vpmulld_avx2(auVar89,auVar55);
  local_528 = vpaddd_avx2(auVar18,auVar88);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_528 = vpslld_avx2(local_528,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar39._4_4_ = iVar5;
    auVar39._0_4_ = iVar5;
    auVar39._8_4_ = iVar5;
    auVar39._12_4_ = iVar5;
    auVar39._16_4_ = iVar5;
    auVar39._20_4_ = iVar5;
    auVar39._24_4_ = iVar5;
    auVar39._28_4_ = iVar5;
    auVar18 = vpaddd_avx2(local_528,auVar39);
    local_528 = vpsrad_avx2(auVar18,auVar11);
  }
  auVar18 = vpaddd_avx2(auVar13,auVar76);
  auVar88 = vpaddd_avx2(auVar74,auVar12);
  auVar79 = vpmulld_avx2(auVar89,auVar79);
  auVar55 = vpmulld_avx2(auVar97,auVar55);
  auVar55 = vpsubd_avx2(auVar79,auVar55);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar55 = vpslld_avx2(auVar55,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar79._4_4_ = iVar5;
    auVar79._0_4_ = iVar5;
    auVar79._8_4_ = iVar5;
    auVar79._12_4_ = iVar5;
    auVar79._16_4_ = iVar5;
    auVar79._20_4_ = iVar5;
    auVar79._24_4_ = iVar5;
    auVar79._28_4_ = iVar5;
    auVar55 = vpaddd_avx2(auVar55,auVar79);
    auVar55 = vpsrad_avx2(auVar55,auVar11);
  }
  auVar18 = vpmulld_avx2(auVar109,auVar18);
  auVar109 = vpmulld_avx2(auVar109,auVar88);
  local_258 = vpaddd_avx2(auVar18,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_258 = vpslld_avx2(local_258,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar80._4_4_ = iVar5;
    auVar80._0_4_ = iVar5;
    auVar80._8_4_ = iVar5;
    auVar80._12_4_ = iVar5;
    auVar80._16_4_ = iVar5;
    auVar80._20_4_ = iVar5;
    auVar80._24_4_ = iVar5;
    auVar80._28_4_ = iVar5;
    auVar79 = vpaddd_avx2(local_258,auVar80);
    local_258 = vpsrad_avx2(auVar79,auVar11);
  }
  auVar13 = vpsubd_avx2(auVar76,auVar13);
  auVar12 = vpsubd_avx2(auVar74,auVar12);
  local_238 = vpsubd_avx2(auVar18,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_238 = vpslld_avx2(local_238,ZEXT416(uVar10));
    }
  }
  else {
    iVar5 = 1 << (cos_bit - 1U & 0x1f);
    auVar19._4_4_ = iVar5;
    auVar19._0_4_ = iVar5;
    auVar19._8_4_ = iVar5;
    auVar19._12_4_ = iVar5;
    auVar19._16_4_ = iVar5;
    auVar19._20_4_ = iVar5;
    auVar19._24_4_ = iVar5;
    auVar19._28_4_ = iVar5;
    auVar74 = vpaddd_avx2(local_238,auVar19);
    local_238 = vpsrad_avx2(auVar74,auVar11);
  }
  auVar18 = vpsubd_avx2(auVar17,auVar41);
  auVar17 = vpsubd_avx2(auVar113,auVar40);
  auVar113._4_4_ = iVar8;
  auVar113._0_4_ = iVar8;
  auVar113._8_4_ = iVar8;
  auVar113._12_4_ = iVar8;
  auVar113._16_4_ = iVar8;
  auVar113._20_4_ = iVar8;
  auVar113._24_4_ = iVar8;
  auVar113._28_4_ = iVar8;
  auVar74 = vpmulld_avx2(auVar113,auVar13);
  auVar109 = vpmulld_avx2(auVar106,auVar12);
  auVar74 = vpaddd_avx2(auVar109,auVar74);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar74 = vpslld_avx2(auVar74,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar40._4_4_ = iVar8;
    auVar40._0_4_ = iVar8;
    auVar40._8_4_ = iVar8;
    auVar40._12_4_ = iVar8;
    auVar40._16_4_ = iVar8;
    auVar40._20_4_ = iVar8;
    auVar40._24_4_ = iVar8;
    auVar40._28_4_ = iVar8;
    auVar74 = vpaddd_avx2(auVar74,auVar40);
    auVar74 = vpsrad_avx2(auVar74,auVar11);
  }
  auVar109 = vpaddd_avx2(auVar17,local_5a8);
  auVar40 = vpaddd_avx2(auVar18,local_4c8);
  auVar13 = vpmulld_avx2(auVar106,auVar13);
  auVar12 = vpmulld_avx2(auVar113,auVar12);
  local_428 = vpsubd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_428 = vpslld_avx2(local_428,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar41._4_4_ = iVar8;
    auVar41._0_4_ = iVar8;
    auVar41._8_4_ = iVar8;
    auVar41._12_4_ = iVar8;
    auVar41._16_4_ = iVar8;
    auVar41._20_4_ = iVar8;
    auVar41._24_4_ = iVar8;
    auVar41._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_428,auVar41);
    local_428 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar12 = vpmulld_avx2(auVar89,auVar109);
  auVar13 = vpmulld_avx2(auVar106,auVar40);
  auVar12 = vpaddd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar12 = vpslld_avx2(auVar12,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar42._4_4_ = iVar8;
    auVar42._0_4_ = iVar8;
    auVar42._8_4_ = iVar8;
    auVar42._12_4_ = iVar8;
    auVar42._16_4_ = iVar8;
    auVar42._20_4_ = iVar8;
    auVar42._24_4_ = iVar8;
    auVar42._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(auVar12,auVar42);
    auVar12 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar17 = vpsubd_avx2(auVar17,local_5a8);
  auVar18 = vpsubd_avx2(auVar18,local_4c8);
  auVar13 = vpmulld_avx2(auVar106,auVar109);
  auVar109 = vpmulld_avx2(auVar89,auVar40);
  auVar13 = vpsubd_avx2(auVar13,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar13 = vpslld_avx2(auVar13,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar43._4_4_ = iVar8;
    auVar43._0_4_ = iVar8;
    auVar43._8_4_ = iVar8;
    auVar43._12_4_ = iVar8;
    auVar43._16_4_ = iVar8;
    auVar43._20_4_ = iVar8;
    auVar43._24_4_ = iVar8;
    auVar43._28_4_ = iVar8;
    auVar13 = vpaddd_avx2(auVar13,auVar43);
    auVar13 = vpsrad_avx2(auVar13,auVar11);
  }
  auVar16 = vpsubd_avx2(auVar16,auVar44);
  auVar15 = vpsubd_avx2(auVar14,auVar15);
  auVar109 = vpmulld_avx2(auVar97,auVar17);
  auVar14 = vpmulld_avx2(auVar89,auVar18);
  auVar109 = vpaddd_avx2(auVar14,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar109 = vpslld_avx2(auVar109,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar44._4_4_ = iVar8;
    auVar44._0_4_ = iVar8;
    auVar44._8_4_ = iVar8;
    auVar44._12_4_ = iVar8;
    auVar44._16_4_ = iVar8;
    auVar44._20_4_ = iVar8;
    auVar44._24_4_ = iVar8;
    auVar44._28_4_ = iVar8;
    auVar109 = vpaddd_avx2(auVar109,auVar44);
    auVar109 = vpsrad_avx2(auVar109,auVar11);
  }
  auVar14 = vpaddd_avx2(auVar37,auVar15);
  auVar44 = vpaddd_avx2(local_1f8,auVar16);
  auVar17 = vpmulld_avx2(auVar89,auVar17);
  auVar18 = vpmulld_avx2(auVar97,auVar18);
  local_5a8 = vpsubd_avx2(auVar17,auVar18);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_5a8 = vpslld_avx2(local_5a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar45._4_4_ = iVar8;
    auVar45._0_4_ = iVar8;
    auVar45._8_4_ = iVar8;
    auVar45._12_4_ = iVar8;
    auVar45._16_4_ = iVar8;
    auVar45._20_4_ = iVar8;
    auVar45._24_4_ = iVar8;
    auVar45._28_4_ = iVar8;
    auVar18 = vpaddd_avx2(local_5a8,auVar45);
    local_5a8 = vpsrad_avx2(auVar18,auVar11);
  }
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x180);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x240);
  auVar81._4_4_ = iVar8;
  auVar81._0_4_ = iVar8;
  auVar81._8_4_ = iVar8;
  auVar81._12_4_ = iVar8;
  auVar81._16_4_ = iVar8;
  auVar81._20_4_ = iVar8;
  auVar81._24_4_ = iVar8;
  auVar81._28_4_ = iVar8;
  auVar90._4_4_ = iVar5;
  auVar90._0_4_ = iVar5;
  auVar90._8_4_ = iVar5;
  auVar90._12_4_ = iVar5;
  auVar90._16_4_ = iVar5;
  auVar90._20_4_ = iVar5;
  auVar90._24_4_ = iVar5;
  auVar90._28_4_ = iVar5;
  auVar18 = vpmulld_avx2(auVar81,auVar44);
  auVar17 = vpmulld_avx2(auVar90,auVar14);
  local_4c8 = vpaddd_avx2(auVar17,auVar18);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4c8 = vpslld_avx2(local_4c8,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar46._4_4_ = iVar3;
    auVar46._0_4_ = iVar3;
    auVar46._8_4_ = iVar3;
    auVar46._12_4_ = iVar3;
    auVar46._16_4_ = iVar3;
    auVar46._20_4_ = iVar3;
    auVar46._24_4_ = iVar3;
    auVar46._28_4_ = iVar3;
    auVar18 = vpaddd_avx2(local_4c8,auVar46);
    local_4c8 = vpsrad_avx2(auVar18,auVar11);
  }
  auVar18 = vpsubd_avx2((undefined1  [32])input[instride],(undefined1  [32])input[instride * 0x1e]);
  auVar17 = vpsubd_avx2((undefined1  [32])input[instride * 0xe],
                        (undefined1  [32])input[instride * 0x11]);
  auVar37 = vpsubd_avx2(auVar15,auVar37);
  auVar16 = vpsubd_avx2(auVar16,local_1f8);
  auVar15 = vpmulld_avx2(auVar90,auVar44);
  auVar14 = vpmulld_avx2(auVar81,auVar14);
  local_348 = vpsubd_avx2(auVar15,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_348 = vpslld_avx2(local_348,ZEXT416(uVar10));
    }
  }
  else {
    iVar3 = 1 << (cos_bit - 1U & 0x1f);
    auVar47._4_4_ = iVar3;
    auVar47._0_4_ = iVar3;
    auVar47._8_4_ = iVar3;
    auVar47._12_4_ = iVar3;
    auVar47._16_4_ = iVar3;
    auVar47._20_4_ = iVar3;
    auVar47._24_4_ = iVar3;
    auVar47._28_4_ = iVar3;
    auVar14 = vpaddd_avx2(local_348,auVar47);
    local_348 = vpsrad_avx2(auVar14,auVar11);
  }
  auVar14 = vpaddd_avx2(auVar17,local_508);
  auVar15 = vpaddd_avx2(auVar18,auVar86);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1c0);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x200);
  auVar82._4_4_ = iVar9;
  auVar82._0_4_ = iVar9;
  auVar82._8_4_ = iVar9;
  auVar82._12_4_ = iVar9;
  auVar82._16_4_ = iVar9;
  auVar82._20_4_ = iVar9;
  auVar82._24_4_ = iVar9;
  auVar82._28_4_ = iVar9;
  auVar95._4_4_ = iVar3;
  auVar95._0_4_ = iVar3;
  auVar95._8_4_ = iVar3;
  auVar95._12_4_ = iVar3;
  auVar95._16_4_ = iVar3;
  auVar95._20_4_ = iVar3;
  auVar95._24_4_ = iVar3;
  auVar95._28_4_ = iVar3;
  auVar44 = vpmulld_avx2(auVar82,auVar16);
  auVar113 = vpmulld_avx2(auVar95,auVar37);
  local_218 = vpaddd_avx2(auVar113,auVar44);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_218 = vpslld_avx2(local_218,ZEXT416(uVar10));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar48._4_4_ = iVar6;
    auVar48._0_4_ = iVar6;
    auVar48._8_4_ = iVar6;
    auVar48._12_4_ = iVar6;
    auVar48._16_4_ = iVar6;
    auVar48._20_4_ = iVar6;
    auVar48._24_4_ = iVar6;
    auVar48._28_4_ = iVar6;
    auVar44 = vpaddd_avx2(local_218,auVar48);
    local_218 = vpsrad_avx2(auVar44,auVar11);
  }
  auVar44 = vpaddd_avx2(auVar14,local_548);
  auVar113 = vpaddd_avx2(auVar15,local_4a8);
  auVar16 = vpmulld_avx2(auVar95,auVar16);
  auVar37 = vpmulld_avx2(auVar82,auVar37);
  local_448 = vpsubd_avx2(auVar16,auVar37);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_448 = vpslld_avx2(local_448,ZEXT416(uVar10));
    }
  }
  else {
    iVar6 = 1 << (cos_bit - 1U & 0x1f);
    auVar49._4_4_ = iVar6;
    auVar49._0_4_ = iVar6;
    auVar49._8_4_ = iVar6;
    auVar49._12_4_ = iVar6;
    auVar49._16_4_ = iVar6;
    auVar49._20_4_ = iVar6;
    auVar49._24_4_ = iVar6;
    auVar49._28_4_ = iVar6;
    auVar37 = vpaddd_avx2(local_448,auVar49);
    local_448 = vpsrad_avx2(auVar37,auVar11);
  }
  iVar8 = -iVar8;
  auVar115._4_4_ = iVar8;
  auVar115._0_4_ = iVar8;
  auVar115._8_4_ = iVar8;
  auVar115._12_4_ = iVar8;
  auVar115._16_4_ = iVar8;
  auVar115._20_4_ = iVar8;
  auVar115._24_4_ = iVar8;
  auVar115._28_4_ = iVar8;
  auVar37 = vpmulld_avx2(auVar115,auVar44);
  auVar16 = vpmulld_avx2(auVar90,auVar113);
  auVar37 = vpaddd_avx2(auVar16,auVar37);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar37 = vpslld_avx2(auVar37,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar50._4_4_ = iVar8;
    auVar50._0_4_ = iVar8;
    auVar50._8_4_ = iVar8;
    auVar50._12_4_ = iVar8;
    auVar50._16_4_ = iVar8;
    auVar50._20_4_ = iVar8;
    auVar50._24_4_ = iVar8;
    auVar50._28_4_ = iVar8;
    auVar37 = vpaddd_avx2(auVar37,auVar50);
    auVar37 = vpsrad_avx2(auVar37,auVar11);
  }
  auVar16 = vpsubd_avx2(auVar14,local_548);
  auVar40 = vpsubd_avx2(auVar15,local_4a8);
  auVar14 = vpmulld_avx2(auVar90,auVar44);
  auVar15 = vpmulld_avx2(auVar115,auVar113);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar14 = vpslld_avx2(auVar14,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar51._4_4_ = iVar8;
    auVar51._0_4_ = iVar8;
    auVar51._8_4_ = iVar8;
    auVar51._12_4_ = iVar8;
    auVar51._16_4_ = iVar8;
    auVar51._20_4_ = iVar8;
    auVar51._24_4_ = iVar8;
    auVar51._28_4_ = iVar8;
    auVar14 = vpaddd_avx2(auVar14,auVar51);
    auVar14 = vpsrad_avx2(auVar14,auVar11);
  }
  auVar44 = vpsubd_avx2(auVar17,local_508);
  auVar18 = vpsubd_avx2(auVar18,auVar86);
  iVar5 = -iVar5;
  auVar72._4_4_ = iVar5;
  auVar72._0_4_ = iVar5;
  auVar72._8_4_ = iVar5;
  auVar72._12_4_ = iVar5;
  auVar72._16_4_ = iVar5;
  auVar72._20_4_ = iVar5;
  auVar72._24_4_ = iVar5;
  auVar72._28_4_ = iVar5;
  auVar86 = vpmulld_avx2(auVar72,auVar16);
  auVar15 = vpmulld_avx2(auVar115,auVar40);
  local_2a8 = vpaddd_avx2(auVar15,auVar86);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_2a8 = vpslld_avx2(local_2a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar52._4_4_ = iVar8;
    auVar52._0_4_ = iVar8;
    auVar52._8_4_ = iVar8;
    auVar52._12_4_ = iVar8;
    auVar52._16_4_ = iVar8;
    auVar52._20_4_ = iVar8;
    auVar52._24_4_ = iVar8;
    auVar52._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(local_2a8,auVar52);
    local_2a8 = vpsrad_avx2(auVar86,auVar11);
  }
  auVar17 = vpsubd_avx2(auVar44,local_528);
  auVar113 = vpsubd_avx2(auVar18,auVar55);
  auVar86 = vpmulld_avx2(auVar115,auVar16);
  auVar15 = vpmulld_avx2(auVar72,auVar40);
  auVar86 = vpsubd_avx2(auVar86,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar86 = vpslld_avx2(auVar86,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar53._4_4_ = iVar8;
    auVar53._0_4_ = iVar8;
    auVar53._8_4_ = iVar8;
    auVar53._12_4_ = iVar8;
    auVar53._16_4_ = iVar8;
    auVar53._20_4_ = iVar8;
    auVar53._24_4_ = iVar8;
    auVar53._28_4_ = iVar8;
    auVar86 = vpaddd_avx2(auVar86,auVar53);
    auVar86 = vpsrad_avx2(auVar86,auVar11);
  }
  iVar9 = -iVar9;
  auVar116._4_4_ = iVar9;
  auVar116._0_4_ = iVar9;
  auVar116._8_4_ = iVar9;
  auVar116._12_4_ = iVar9;
  auVar116._16_4_ = iVar9;
  auVar116._20_4_ = iVar9;
  auVar116._24_4_ = iVar9;
  auVar116._28_4_ = iVar9;
  auVar15 = vpmulld_avx2(auVar116,auVar17);
  auVar16 = vpmulld_avx2(auVar95,auVar113);
  local_308 = vpaddd_avx2(auVar16,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_308 = vpslld_avx2(local_308,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar54._4_4_ = iVar8;
    auVar54._0_4_ = iVar8;
    auVar54._8_4_ = iVar8;
    auVar54._12_4_ = iVar8;
    auVar54._16_4_ = iVar8;
    auVar54._20_4_ = iVar8;
    auVar54._24_4_ = iVar8;
    auVar54._28_4_ = iVar8;
    auVar15 = vpaddd_avx2(local_308,auVar54);
    local_308 = vpsrad_avx2(auVar15,auVar11);
  }
  auVar40 = vpsubd_avx2(auVar94,auVar77);
  auVar41 = vpsubd_avx2(auVar87,auVar75);
  auVar94 = vpaddd_avx2(auVar44,local_528);
  auVar15 = vpaddd_avx2(auVar18,auVar55);
  auVar18 = vpmulld_avx2(auVar95,auVar17);
  auVar16 = vpmulld_avx2(auVar116,auVar113);
  local_488 = vpsubd_avx2(auVar18,auVar16);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_488 = vpslld_avx2(local_488,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar55._4_4_ = iVar8;
    auVar55._0_4_ = iVar8;
    auVar55._8_4_ = iVar8;
    auVar55._12_4_ = iVar8;
    auVar55._16_4_ = iVar8;
    auVar55._20_4_ = iVar8;
    auVar55._24_4_ = iVar8;
    auVar55._28_4_ = iVar8;
    auVar18 = vpaddd_avx2(local_488,auVar55);
    local_488 = vpsrad_avx2(auVar18,auVar11);
  }
  auVar18 = vpaddd_avx2(auVar41,auVar62);
  auVar16 = vpaddd_avx2(auVar40,local_468);
  iVar3 = -iVar3;
  auVar56._4_4_ = iVar3;
  auVar56._0_4_ = iVar3;
  auVar56._8_4_ = iVar3;
  auVar56._12_4_ = iVar3;
  auVar56._16_4_ = iVar3;
  auVar56._20_4_ = iVar3;
  auVar56._24_4_ = iVar3;
  auVar56._28_4_ = iVar3;
  auVar44 = vpmulld_avx2(auVar56,auVar94);
  auVar17 = vpmulld_avx2(auVar116,auVar15);
  local_508 = vpaddd_avx2(auVar44,auVar17);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_508 = vpslld_avx2(local_508,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar107._4_4_ = iVar8;
    auVar107._0_4_ = iVar8;
    auVar107._8_4_ = iVar8;
    auVar107._12_4_ = iVar8;
    auVar107._16_4_ = iVar8;
    auVar107._20_4_ = iVar8;
    auVar107._24_4_ = iVar8;
    auVar107._28_4_ = iVar8;
    auVar44 = vpaddd_avx2(local_508,auVar107);
    local_508 = vpsrad_avx2(auVar44,auVar11);
  }
  auVar44 = vpaddd_avx2(auVar12,auVar18);
  auVar17 = vpaddd_avx2(auVar13,auVar16);
  auVar94 = vpmulld_avx2(auVar116,auVar94);
  auVar15 = vpmulld_avx2(auVar56,auVar15);
  local_3c8 = vpsubd_avx2(auVar94,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_3c8 = vpslld_avx2(local_3c8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar57._4_4_ = iVar8;
    auVar57._0_4_ = iVar8;
    auVar57._8_4_ = iVar8;
    auVar57._12_4_ = iVar8;
    auVar57._16_4_ = iVar8;
    auVar57._20_4_ = iVar8;
    auVar57._24_4_ = iVar8;
    auVar57._28_4_ = iVar8;
    auVar94 = vpaddd_avx2(local_3c8,auVar57);
    local_3c8 = vpsrad_avx2(auVar94,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x170);
  auVar103._4_4_ = uVar2;
  auVar103._0_4_ = uVar2;
  auVar103._8_4_ = uVar2;
  auVar103._12_4_ = uVar2;
  auVar103._16_4_ = uVar2;
  auVar103._20_4_ = uVar2;
  auVar103._24_4_ = uVar2;
  auVar103._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x250);
  auVar58._4_4_ = uVar2;
  auVar58._0_4_ = uVar2;
  auVar58._8_4_ = uVar2;
  auVar58._12_4_ = uVar2;
  auVar58._16_4_ = uVar2;
  auVar58._20_4_ = uVar2;
  auVar58._24_4_ = uVar2;
  auVar58._28_4_ = uVar2;
  auVar94 = vpmulld_avx2(auVar103,auVar17);
  auVar15 = vpmulld_avx2(auVar58,auVar44);
  auVar94 = vpaddd_avx2(auVar15,auVar94);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar94 = vpslld_avx2(auVar94,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar98._4_4_ = iVar8;
    auVar98._0_4_ = iVar8;
    auVar98._8_4_ = iVar8;
    auVar98._12_4_ = iVar8;
    auVar98._16_4_ = iVar8;
    auVar98._20_4_ = iVar8;
    auVar98._24_4_ = iVar8;
    auVar98._28_4_ = iVar8;
    auVar94 = vpaddd_avx2(auVar94,auVar98);
    auVar94 = vpsrad_avx2(auVar94,auVar11);
  }
  auVar15 = vpsubd_avx2(auVar18,auVar12);
  auVar18 = vpsubd_avx2(auVar16,auVar13);
  auVar12 = vpmulld_avx2(auVar58,auVar17);
  auVar13 = vpmulld_avx2(auVar103,auVar44);
  local_328 = vpsubd_avx2(auVar12,auVar13);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_328 = vpslld_avx2(local_328,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar20._4_4_ = iVar8;
    auVar20._0_4_ = iVar8;
    auVar20._8_4_ = iVar8;
    auVar20._12_4_ = iVar8;
    auVar20._16_4_ = iVar8;
    auVar20._20_4_ = iVar8;
    auVar20._24_4_ = iVar8;
    auVar20._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_328,auVar20);
    local_328 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar62 = vpsubd_avx2(auVar41,auVar62);
  auVar16 = vpsubd_avx2(auVar40,local_468);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1f0);
  auVar110._4_4_ = uVar2;
  auVar110._0_4_ = uVar2;
  auVar110._8_4_ = uVar2;
  auVar110._12_4_ = uVar2;
  auVar110._16_4_ = uVar2;
  auVar110._20_4_ = uVar2;
  auVar110._24_4_ = uVar2;
  auVar110._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1d0);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  auVar59._16_4_ = uVar2;
  auVar59._20_4_ = uVar2;
  auVar59._24_4_ = uVar2;
  auVar59._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar110,auVar18);
  auVar13 = vpmulld_avx2(auVar59,auVar15);
  local_3a8 = vpaddd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_3a8 = vpslld_avx2(local_3a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar104._4_4_ = iVar8;
    auVar104._0_4_ = iVar8;
    auVar104._8_4_ = iVar8;
    auVar104._12_4_ = iVar8;
    auVar104._16_4_ = iVar8;
    auVar104._20_4_ = iVar8;
    auVar104._24_4_ = iVar8;
    auVar104._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_3a8,auVar104);
    local_3a8 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar44 = vpsubd_avx2(auVar62,auVar109);
  auVar17 = vpsubd_avx2(auVar16,local_5a8);
  auVar12 = vpmulld_avx2(auVar59,auVar18);
  auVar13 = vpmulld_avx2(auVar110,auVar15);
  local_468 = vpsubd_avx2(auVar12,auVar13);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_468 = vpslld_avx2(local_468,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar60._4_4_ = iVar8;
    auVar60._0_4_ = iVar8;
    auVar60._8_4_ = iVar8;
    auVar60._12_4_ = iVar8;
    auVar60._16_4_ = iVar8;
    auVar60._20_4_ = iVar8;
    auVar60._24_4_ = iVar8;
    auVar60._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_468,auVar60);
    local_468 = vpsrad_avx2(auVar12,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1b0);
  auVar99._4_4_ = uVar2;
  auVar99._0_4_ = uVar2;
  auVar99._8_4_ = uVar2;
  auVar99._12_4_ = uVar2;
  auVar99._16_4_ = uVar2;
  auVar99._20_4_ = uVar2;
  auVar99._24_4_ = uVar2;
  auVar99._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x210);
  auVar111._4_4_ = uVar2;
  auVar111._0_4_ = uVar2;
  auVar111._8_4_ = uVar2;
  auVar111._12_4_ = uVar2;
  auVar111._16_4_ = uVar2;
  auVar111._20_4_ = uVar2;
  auVar111._24_4_ = uVar2;
  auVar111._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar99,auVar17);
  auVar13 = vpmulld_avx2(auVar111,auVar44);
  local_548 = vpaddd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_548 = vpslld_avx2(local_548,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar61._4_4_ = iVar8;
    auVar61._0_4_ = iVar8;
    auVar61._8_4_ = iVar8;
    auVar61._12_4_ = iVar8;
    auVar61._16_4_ = iVar8;
    auVar61._20_4_ = iVar8;
    auVar61._24_4_ = iVar8;
    auVar61._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_548,auVar61);
    local_548 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar18 = vpsubd_avx2((undefined1  [32])*input,(undefined1  [32])input[instride * 0x1f]);
  auVar113 = vpsubd_avx2((undefined1  [32])input[instride * 0xf],
                         (undefined1  [32])input[instride * 0x10]);
  auVar12 = vpaddd_avx2(auVar109,auVar62);
  auVar13 = vpaddd_avx2(local_5a8,auVar16);
  auVar109 = vpmulld_avx2(auVar111,auVar17);
  auVar15 = vpmulld_avx2(auVar99,auVar44);
  local_3e8 = vpsubd_avx2(auVar109,auVar15);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_3e8 = vpslld_avx2(local_3e8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar62._4_4_ = iVar8;
    auVar62._0_4_ = iVar8;
    auVar62._8_4_ = iVar8;
    auVar62._12_4_ = iVar8;
    auVar62._16_4_ = iVar8;
    auVar62._20_4_ = iVar8;
    auVar62._24_4_ = iVar8;
    auVar62._28_4_ = iVar8;
    auVar109 = vpaddd_avx2(local_3e8,auVar62);
    local_3e8 = vpsrad_avx2(auVar109,auVar11);
  }
  auVar109 = vpaddd_avx2(auVar113,local_2e8);
  auVar15 = vpaddd_avx2(auVar18,local_4e8);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x230);
  auVar117._4_4_ = uVar2;
  auVar117._0_4_ = uVar2;
  auVar117._8_4_ = uVar2;
  auVar117._12_4_ = uVar2;
  auVar117._16_4_ = uVar2;
  auVar117._20_4_ = uVar2;
  auVar117._24_4_ = uVar2;
  auVar117._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 400);
  auVar63._4_4_ = uVar2;
  auVar63._0_4_ = uVar2;
  auVar63._8_4_ = uVar2;
  auVar63._12_4_ = uVar2;
  auVar63._16_4_ = uVar2;
  auVar63._20_4_ = uVar2;
  auVar63._24_4_ = uVar2;
  auVar63._28_4_ = uVar2;
  auVar62 = vpmulld_avx2(auVar117,auVar13);
  auVar16 = vpmulld_avx2(auVar63,auVar12);
  local_4a8 = vpaddd_avx2(auVar16,auVar62);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4a8 = vpslld_avx2(local_4a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar100._4_4_ = iVar8;
    auVar100._0_4_ = iVar8;
    auVar100._8_4_ = iVar8;
    auVar100._12_4_ = iVar8;
    auVar100._16_4_ = iVar8;
    auVar100._20_4_ = iVar8;
    auVar100._24_4_ = iVar8;
    auVar100._28_4_ = iVar8;
    auVar62 = vpaddd_avx2(local_4a8,auVar100);
    local_4a8 = vpsrad_avx2(auVar62,auVar11);
  }
  auVar62 = vpaddd_avx2(auVar109,local_588);
  auVar16 = vpaddd_avx2(auVar15,local_568);
  auVar13 = vpmulld_avx2(auVar63,auVar13);
  auVar12 = vpmulld_avx2(auVar117,auVar12);
  local_5a8 = vpsubd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_5a8 = vpslld_avx2(local_5a8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar21._4_4_ = iVar8;
    auVar21._0_4_ = iVar8;
    auVar21._8_4_ = iVar8;
    auVar21._12_4_ = iVar8;
    auVar21._16_4_ = iVar8;
    auVar21._20_4_ = iVar8;
    auVar21._24_4_ = iVar8;
    auVar21._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_5a8,auVar21);
    local_5a8 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar12 = vpaddd_avx2(auVar37,auVar62);
  auVar13 = vpaddd_avx2(auVar16,auVar14);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x168);
  auVar118._4_4_ = uVar2;
  auVar118._0_4_ = uVar2;
  auVar118._8_4_ = uVar2;
  auVar118._12_4_ = uVar2;
  auVar118._16_4_ = uVar2;
  auVar118._20_4_ = uVar2;
  auVar118._24_4_ = uVar2;
  auVar118._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 600);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  auVar64._16_4_ = uVar2;
  auVar64._20_4_ = uVar2;
  auVar64._24_4_ = uVar2;
  auVar64._28_4_ = uVar2;
  auVar44 = vpmulld_avx2(auVar118,auVar13);
  auVar17 = vpmulld_avx2(auVar64,auVar12);
  auVar44 = vpaddd_avx2(auVar17,auVar44);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar44 = vpslld_avx2(auVar44,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar121._4_4_ = iVar8;
    auVar121._0_4_ = iVar8;
    auVar121._8_4_ = iVar8;
    auVar121._12_4_ = iVar8;
    auVar121._16_4_ = iVar8;
    auVar121._20_4_ = iVar8;
    auVar121._24_4_ = iVar8;
    auVar121._28_4_ = iVar8;
    auVar44 = vpaddd_avx2(auVar44,auVar121);
    auVar44 = vpsrad_avx2(auVar44,auVar11);
  }
  auVar62 = vpsubd_avx2(auVar62,auVar37);
  auVar14 = vpsubd_avx2(auVar16,auVar14);
  auVar13 = vpmulld_avx2(auVar64,auVar13);
  auVar12 = vpmulld_avx2(auVar118,auVar12);
  local_408 = vpsubd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_408 = vpslld_avx2(local_408,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar22._4_4_ = iVar8;
    auVar22._0_4_ = iVar8;
    auVar22._8_4_ = iVar8;
    auVar22._12_4_ = iVar8;
    auVar22._16_4_ = iVar8;
    auVar22._20_4_ = iVar8;
    auVar22._24_4_ = iVar8;
    auVar22._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(local_408,auVar22);
    local_408 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar109 = vpsubd_avx2(auVar109,local_588);
  auVar15 = vpsubd_avx2(auVar15,local_568);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1e8);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  auVar83._16_4_ = uVar2;
  auVar83._20_4_ = uVar2;
  auVar83._24_4_ = uVar2;
  auVar83._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1d8);
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  auVar65._16_4_ = uVar2;
  auVar65._20_4_ = uVar2;
  auVar65._24_4_ = uVar2;
  auVar65._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar83,auVar14);
  auVar13 = vpmulld_avx2(auVar65,auVar62);
  auVar12 = vpaddd_avx2(auVar13,auVar12);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      auVar12 = vpslld_avx2(auVar12,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar23._4_4_ = iVar8;
    auVar23._0_4_ = iVar8;
    auVar23._8_4_ = iVar8;
    auVar23._12_4_ = iVar8;
    auVar23._16_4_ = iVar8;
    auVar23._20_4_ = iVar8;
    auVar23._24_4_ = iVar8;
    auVar23._28_4_ = iVar8;
    auVar12 = vpaddd_avx2(auVar12,auVar23);
    auVar12 = vpsrad_avx2(auVar12,auVar11);
  }
  auVar37 = vpsubd_avx2(auVar109,local_2a8);
  auVar16 = vpsubd_avx2(auVar15,auVar86);
  auVar13 = vpmulld_avx2(auVar65,auVar14);
  auVar14 = vpmulld_avx2(auVar83,auVar62);
  local_568 = vpsubd_avx2(auVar13,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_568 = vpslld_avx2(local_568,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar24._4_4_ = iVar8;
    auVar24._0_4_ = iVar8;
    auVar24._8_4_ = iVar8;
    auVar24._12_4_ = iVar8;
    auVar24._16_4_ = iVar8;
    auVar24._20_4_ = iVar8;
    auVar24._24_4_ = iVar8;
    auVar24._28_4_ = iVar8;
    auVar13 = vpaddd_avx2(local_568,auVar24);
    local_568 = vpsrad_avx2(auVar13,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1a8);
  auVar84._4_4_ = uVar2;
  auVar84._0_4_ = uVar2;
  auVar84._8_4_ = uVar2;
  auVar84._12_4_ = uVar2;
  auVar84._16_4_ = uVar2;
  auVar84._20_4_ = uVar2;
  auVar84._24_4_ = uVar2;
  auVar84._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x218);
  auVar101._4_4_ = uVar2;
  auVar101._0_4_ = uVar2;
  auVar101._8_4_ = uVar2;
  auVar101._12_4_ = uVar2;
  auVar101._16_4_ = uVar2;
  auVar101._20_4_ = uVar2;
  auVar101._24_4_ = uVar2;
  auVar101._28_4_ = uVar2;
  auVar13 = vpmulld_avx2(auVar84,auVar16);
  auVar14 = vpmulld_avx2(auVar101,auVar37);
  local_4e8 = vpaddd_avx2(auVar14,auVar13);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      local_4e8 = vpslld_avx2(local_4e8,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar25._4_4_ = iVar8;
    auVar25._0_4_ = iVar8;
    auVar25._8_4_ = iVar8;
    auVar25._12_4_ = iVar8;
    auVar25._16_4_ = iVar8;
    auVar25._20_4_ = iVar8;
    auVar25._24_4_ = iVar8;
    auVar25._28_4_ = iVar8;
    auVar13 = vpaddd_avx2(local_4e8,auVar25);
    local_4e8 = vpsrad_avx2(auVar13,auVar11);
  }
  auVar62 = vpsubd_avx2(auVar113,local_2e8);
  auVar18 = vpsubd_avx2(auVar18,auVar26);
  auVar13 = vpaddd_avx2(auVar109,local_2a8);
  auVar86 = vpaddd_avx2(auVar15,auVar86);
  auVar109 = vpmulld_avx2(auVar101,auVar16);
  auVar14 = vpmulld_avx2(auVar84,auVar37);
  alVar73 = (__m256i)vpsubd_avx2(auVar109,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar73 = (__m256i)vpslld_avx2((undefined1  [32])alVar73,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar26._4_4_ = iVar8;
    auVar26._0_4_ = iVar8;
    auVar26._8_4_ = iVar8;
    auVar26._12_4_ = iVar8;
    auVar26._16_4_ = iVar8;
    auVar26._20_4_ = iVar8;
    auVar26._24_4_ = iVar8;
    auVar26._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar73,auVar26);
    alVar73 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  auVar15 = vpsubd_avx2(auVar62,auVar69);
  auVar37 = vpsubd_avx2(auVar18,local_388);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x228);
  auVar123._4_4_ = uVar2;
  auVar123._0_4_ = uVar2;
  auVar123._8_4_ = uVar2;
  auVar123._12_4_ = uVar2;
  auVar123._16_4_ = uVar2;
  auVar123._20_4_ = uVar2;
  auVar123._24_4_ = uVar2;
  auVar123._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x198);
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  auVar66._16_4_ = uVar2;
  auVar66._20_4_ = uVar2;
  auVar66._24_4_ = uVar2;
  auVar66._28_4_ = uVar2;
  auVar109 = vpmulld_avx2(auVar123,auVar86);
  auVar14 = vpmulld_avx2(auVar66,auVar13);
  alVar122 = (__m256i)vpaddd_avx2(auVar14,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar122 = (__m256i)vpslld_avx2((undefined1  [32])alVar122,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar27._4_4_ = iVar8;
    auVar27._0_4_ = iVar8;
    auVar27._8_4_ = iVar8;
    auVar27._12_4_ = iVar8;
    auVar27._16_4_ = iVar8;
    auVar27._20_4_ = iVar8;
    auVar27._24_4_ = iVar8;
    auVar27._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar122,auVar27);
    alVar122 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  auVar109 = vpaddd_avx2(local_308,auVar15);
  auVar14 = vpaddd_avx2(auVar37,local_488);
  auVar86 = vpmulld_avx2(auVar66,auVar86);
  auVar13 = vpmulld_avx2(auVar123,auVar13);
  alVar96 = (__m256i)vpsubd_avx2(auVar86,auVar13);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar96 = (__m256i)vpslld_avx2((undefined1  [32])alVar96,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar28._4_4_ = iVar8;
    auVar28._0_4_ = iVar8;
    auVar28._8_4_ = iVar8;
    auVar28._12_4_ = iVar8;
    auVar28._16_4_ = iVar8;
    auVar28._20_4_ = iVar8;
    auVar28._24_4_ = iVar8;
    auVar28._28_4_ = iVar8;
    auVar86 = vpaddd_avx2((undefined1  [32])alVar96,auVar28);
    alVar96 = (__m256i)vpsrad_avx2(auVar86,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x188);
  auVar124._4_4_ = uVar2;
  auVar124._0_4_ = uVar2;
  auVar124._8_4_ = uVar2;
  auVar124._12_4_ = uVar2;
  auVar124._16_4_ = uVar2;
  auVar124._20_4_ = uVar2;
  auVar124._24_4_ = uVar2;
  auVar124._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x238);
  auVar67._4_4_ = uVar2;
  auVar67._0_4_ = uVar2;
  auVar67._8_4_ = uVar2;
  auVar67._12_4_ = uVar2;
  auVar67._16_4_ = uVar2;
  auVar67._20_4_ = uVar2;
  auVar67._24_4_ = uVar2;
  auVar67._28_4_ = uVar2;
  auVar86 = vpmulld_avx2(auVar124,auVar14);
  auVar13 = vpmulld_avx2(auVar67,auVar109);
  alVar108 = (__m256i)vpaddd_avx2(auVar13,auVar86);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar108 = (__m256i)vpslld_avx2((undefined1  [32])alVar108,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar29._4_4_ = iVar8;
    auVar29._0_4_ = iVar8;
    auVar29._8_4_ = iVar8;
    auVar29._12_4_ = iVar8;
    auVar29._16_4_ = iVar8;
    auVar29._20_4_ = iVar8;
    auVar29._24_4_ = iVar8;
    auVar29._28_4_ = iVar8;
    auVar86 = vpaddd_avx2((undefined1  [32])alVar108,auVar29);
    alVar108 = (__m256i)vpsrad_avx2(auVar86,auVar11);
  }
  auVar15 = vpsubd_avx2(auVar15,local_308);
  auVar37 = vpsubd_avx2(auVar37,local_488);
  auVar86 = vpmulld_avx2(auVar67,auVar14);
  auVar13 = vpmulld_avx2(auVar124,auVar109);
  alVar114 = (__m256i)vpsubd_avx2(auVar86,auVar13);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar114 = (__m256i)vpslld_avx2((undefined1  [32])alVar114,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar30._4_4_ = iVar8;
    auVar30._0_4_ = iVar8;
    auVar30._8_4_ = iVar8;
    auVar30._12_4_ = iVar8;
    auVar30._16_4_ = iVar8;
    auVar30._20_4_ = iVar8;
    auVar30._24_4_ = iVar8;
    auVar30._28_4_ = iVar8;
    auVar86 = vpaddd_avx2((undefined1  [32])alVar114,auVar30);
    alVar114 = (__m256i)vpsrad_avx2(auVar86,auVar11);
  }
  auVar86 = vpaddd_avx2(auVar62,auVar69);
  auVar13 = vpaddd_avx2(auVar18,local_388);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x208);
  auVar119._4_4_ = uVar2;
  auVar119._0_4_ = uVar2;
  auVar119._8_4_ = uVar2;
  auVar119._12_4_ = uVar2;
  auVar119._16_4_ = uVar2;
  auVar119._20_4_ = uVar2;
  auVar119._24_4_ = uVar2;
  auVar119._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1b8);
  auVar91._4_4_ = uVar2;
  auVar91._0_4_ = uVar2;
  auVar91._8_4_ = uVar2;
  auVar91._12_4_ = uVar2;
  auVar91._16_4_ = uVar2;
  auVar91._20_4_ = uVar2;
  auVar91._24_4_ = uVar2;
  auVar91._28_4_ = uVar2;
  auVar109 = vpmulld_avx2(auVar119,auVar37);
  auVar14 = vpmulld_avx2(auVar91,auVar15);
  alVar102 = (__m256i)vpaddd_avx2(auVar14,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar102 = (__m256i)vpslld_avx2((undefined1  [32])alVar102,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar31._4_4_ = iVar8;
    auVar31._0_4_ = iVar8;
    auVar31._8_4_ = iVar8;
    auVar31._12_4_ = iVar8;
    auVar31._16_4_ = iVar8;
    auVar31._20_4_ = iVar8;
    auVar31._24_4_ = iVar8;
    auVar31._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar102,auVar31);
    alVar102 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  auVar62 = vpsubd_avx2(auVar86,local_508);
  auVar18 = vpsubd_avx2(auVar13,local_3c8);
  auVar109 = vpmulld_avx2(auVar91,auVar37);
  auVar14 = vpmulld_avx2(auVar119,auVar15);
  alVar105 = (__m256i)vpsubd_avx2(auVar109,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar105 = (__m256i)vpslld_avx2((undefined1  [32])alVar105,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar32._4_4_ = iVar8;
    auVar32._0_4_ = iVar8;
    auVar32._8_4_ = iVar8;
    auVar32._12_4_ = iVar8;
    auVar32._16_4_ = iVar8;
    auVar32._20_4_ = iVar8;
    auVar32._24_4_ = iVar8;
    auVar32._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar105,auVar32);
    alVar105 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1c8);
  auVar92._4_4_ = uVar2;
  auVar92._0_4_ = uVar2;
  auVar92._8_4_ = uVar2;
  auVar92._12_4_ = uVar2;
  auVar92._16_4_ = uVar2;
  auVar92._20_4_ = uVar2;
  auVar92._24_4_ = uVar2;
  auVar92._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1f8);
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar33._16_4_ = uVar2;
  auVar33._20_4_ = uVar2;
  auVar33._24_4_ = uVar2;
  auVar33._28_4_ = uVar2;
  auVar109 = vpmulld_avx2(auVar92,auVar18);
  auVar14 = vpmulld_avx2(auVar33,auVar62);
  alVar120 = (__m256i)vpaddd_avx2(auVar14,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar120 = (__m256i)vpslld_avx2((undefined1  [32])alVar120,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar126._4_4_ = iVar8;
    auVar126._0_4_ = iVar8;
    auVar126._8_4_ = iVar8;
    auVar126._12_4_ = iVar8;
    auVar126._16_4_ = iVar8;
    auVar126._20_4_ = iVar8;
    auVar126._24_4_ = iVar8;
    auVar126._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar120,auVar126);
    alVar120 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  auVar86 = vpaddd_avx2(auVar86,local_508);
  auVar13 = vpaddd_avx2(auVar13,local_3c8);
  auVar109 = vpmulld_avx2(auVar33,auVar18);
  auVar14 = vpmulld_avx2(auVar92,auVar62);
  alVar68 = (__m256i)vpsubd_avx2(auVar109,auVar14);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar68 = (__m256i)vpslld_avx2((undefined1  [32])alVar68,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar34._4_4_ = iVar8;
    auVar34._0_4_ = iVar8;
    auVar34._8_4_ = iVar8;
    auVar34._12_4_ = iVar8;
    auVar34._16_4_ = iVar8;
    auVar34._20_4_ = iVar8;
    auVar34._24_4_ = iVar8;
    auVar34._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar68,auVar34);
    alVar68 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x248);
  auVar35._4_4_ = uVar2;
  auVar35._0_4_ = uVar2;
  auVar35._8_4_ = uVar2;
  auVar35._12_4_ = uVar2;
  auVar35._16_4_ = uVar2;
  auVar35._20_4_ = uVar2;
  auVar35._24_4_ = uVar2;
  auVar35._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x178);
  auVar85._4_4_ = uVar2;
  auVar85._0_4_ = uVar2;
  auVar85._8_4_ = uVar2;
  auVar85._12_4_ = uVar2;
  auVar85._16_4_ = uVar2;
  auVar85._20_4_ = uVar2;
  auVar85._24_4_ = uVar2;
  auVar85._28_4_ = uVar2;
  auVar109 = vpmulld_avx2(auVar35,auVar13);
  auVar14 = vpmulld_avx2(auVar85,auVar86);
  alVar112 = (__m256i)vpaddd_avx2(auVar14,auVar109);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar112 = (__m256i)vpslld_avx2((undefined1  [32])alVar112,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar93._4_4_ = iVar8;
    auVar93._0_4_ = iVar8;
    auVar93._8_4_ = iVar8;
    auVar93._12_4_ = iVar8;
    auVar93._16_4_ = iVar8;
    auVar93._20_4_ = iVar8;
    auVar93._24_4_ = iVar8;
    auVar93._28_4_ = iVar8;
    auVar109 = vpaddd_avx2((undefined1  [32])alVar112,auVar93);
    alVar112 = (__m256i)vpsrad_avx2(auVar109,auVar11);
  }
  auVar13 = vpmulld_avx2(auVar85,auVar13);
  auVar86 = vpmulld_avx2(auVar35,auVar86);
  alVar125 = (__m256i)vpsubd_avx2(auVar13,auVar86);
  if (cos_bit < '\x01') {
    if (cos_bit != '\0') {
      alVar125 = (__m256i)vpslld_avx2((undefined1  [32])alVar125,ZEXT416(uVar10));
    }
  }
  else {
    iVar8 = 1 << (cos_bit - 1U & 0x1f);
    auVar36._4_4_ = iVar8;
    auVar36._0_4_ = iVar8;
    auVar36._8_4_ = iVar8;
    auVar36._12_4_ = iVar8;
    auVar36._16_4_ = iVar8;
    auVar36._20_4_ = iVar8;
    auVar36._24_4_ = iVar8;
    auVar36._28_4_ = iVar8;
    auVar86 = vpaddd_avx2((undefined1  [32])alVar125,auVar36);
    alVar125 = (__m256i)vpsrad_avx2(auVar86,auVar11);
  }
  (*output)[0] = local_258._0_8_;
  (*output)[1] = local_258._8_8_;
  (*output)[2] = local_258._16_8_;
  (*output)[3] = local_258._24_8_;
  palVar1 = output + outstride * 0x1f;
  (*palVar1)[0] = local_408._0_8_;
  (*palVar1)[1] = local_408._8_8_;
  (*palVar1)[2] = local_408._16_8_;
  (*palVar1)[3] = local_408._24_8_;
  local_528._0_8_ = auVar44._0_8_;
  local_528._8_8_ = auVar44._8_8_;
  local_528._16_8_ = auVar44._16_8_;
  local_528._24_8_ = auVar44._24_8_;
  palVar1 = output + outstride;
  (*palVar1)[0] = local_528._0_8_;
  (*palVar1)[1] = local_528._8_8_;
  (*palVar1)[2] = local_528._16_8_;
  (*palVar1)[3] = local_528._24_8_;
  palVar1 = output + outstride * 0x1e;
  (*palVar1)[0] = local_328._0_8_;
  (*palVar1)[1] = local_328._8_8_;
  (*palVar1)[2] = local_328._16_8_;
  (*palVar1)[3] = local_328._24_8_;
  local_2c8 = auVar94._0_8_;
  lStack_2c0 = auVar94._8_8_;
  lStack_2b8 = auVar94._16_8_;
  lStack_2b0 = auVar94._24_8_;
  palVar1 = output + outstride * 2;
  (*palVar1)[0] = local_2c8;
  (*palVar1)[1] = lStack_2c0;
  (*palVar1)[2] = lStack_2b8;
  (*palVar1)[3] = lStack_2b0;
  output[outstride * 0x1d] = alVar112;
  output[outstride * 3] = alVar125;
  palVar1 = output + outstride * 0x1c;
  (*palVar1)[0] = local_348._0_8_;
  (*palVar1)[1] = local_348._8_8_;
  (*palVar1)[2] = local_348._16_8_;
  (*palVar1)[3] = local_348._24_8_;
  palVar1 = output + outstride * 4;
  (*palVar1)[0] = local_4c8._0_8_;
  (*palVar1)[1] = local_4c8._8_8_;
  (*palVar1)[2] = local_4c8._16_8_;
  (*palVar1)[3] = local_4c8._24_8_;
  output[outstride * 0x1b] = alVar114;
  output[outstride * 5] = alVar108;
  palVar1 = output + outstride * 0x1a;
  (*palVar1)[0] = local_4a8._0_8_;
  (*palVar1)[1] = local_4a8._8_8_;
  (*palVar1)[2] = local_4a8._16_8_;
  (*palVar1)[3] = local_4a8._24_8_;
  palVar1 = output + outstride * 6;
  (*palVar1)[0] = local_5a8._0_8_;
  (*palVar1)[1] = local_5a8._8_8_;
  (*palVar1)[2] = local_5a8._16_8_;
  (*palVar1)[3] = local_5a8._24_8_;
  output[outstride * 0x19] = alVar122;
  output[outstride * 7] = alVar96;
  palVar1 = output + outstride * 0x18;
  (*palVar1)[0] = local_428._0_8_;
  (*palVar1)[1] = local_428._8_8_;
  (*palVar1)[2] = local_428._16_8_;
  (*palVar1)[3] = local_428._24_8_;
  local_1b8 = auVar74._0_8_;
  lStack_1b0 = auVar74._8_8_;
  lStack_1a8 = auVar74._16_8_;
  lStack_1a0 = auVar74._24_8_;
  palVar1 = output + outstride * 8;
  (*palVar1)[0] = local_1b8;
  (*palVar1)[1] = lStack_1b0;
  (*palVar1)[2] = lStack_1a8;
  (*palVar1)[3] = lStack_1a0;
  output[outstride * 0x17] = alVar73;
  palVar1 = output + outstride * 9;
  (*palVar1)[0] = local_4e8._0_8_;
  (*palVar1)[1] = local_4e8._8_8_;
  (*palVar1)[2] = local_4e8._16_8_;
  (*palVar1)[3] = local_4e8._24_8_;
  palVar1 = output + outstride * 0x16;
  (*palVar1)[0] = local_3e8._0_8_;
  (*palVar1)[1] = local_3e8._8_8_;
  (*palVar1)[2] = local_3e8._16_8_;
  (*palVar1)[3] = local_3e8._24_8_;
  palVar1 = output + outstride * 10;
  (*palVar1)[0] = local_548._0_8_;
  (*palVar1)[1] = local_548._8_8_;
  (*palVar1)[2] = local_548._16_8_;
  (*palVar1)[3] = local_548._24_8_;
  output[outstride * 0x15] = alVar102;
  output[outstride * 0xb] = alVar105;
  palVar1 = output + outstride * 0x14;
  (*palVar1)[0] = local_218._0_8_;
  (*palVar1)[1] = local_218._8_8_;
  (*palVar1)[2] = local_218._16_8_;
  (*palVar1)[3] = local_218._24_8_;
  palVar1 = output + outstride * 0xc;
  (*palVar1)[0] = local_448._0_8_;
  (*palVar1)[1] = local_448._8_8_;
  (*palVar1)[2] = local_448._16_8_;
  (*palVar1)[3] = local_448._24_8_;
  output[outstride * 0x13] = alVar68;
  output[outstride * 0xd] = alVar120;
  palVar1 = output + outstride * 0x12;
  (*palVar1)[0] = local_3a8._0_8_;
  (*palVar1)[1] = local_3a8._8_8_;
  (*palVar1)[2] = local_3a8._16_8_;
  (*palVar1)[3] = local_3a8._24_8_;
  palVar1 = output + outstride * 0xe;
  (*palVar1)[0] = local_468._0_8_;
  (*palVar1)[1] = local_468._8_8_;
  (*palVar1)[2] = local_468._16_8_;
  (*palVar1)[3] = local_468._24_8_;
  local_588._0_8_ = auVar12._0_8_;
  local_588._8_8_ = auVar12._8_8_;
  local_588._16_8_ = auVar12._16_8_;
  local_588._24_8_ = auVar12._24_8_;
  palVar1 = output + outstride * 0x11;
  (*palVar1)[0] = local_588._0_8_;
  (*palVar1)[1] = local_588._8_8_;
  (*palVar1)[2] = local_588._16_8_;
  (*palVar1)[3] = local_588._24_8_;
  palVar1 = output + outstride * 0xf;
  (*palVar1)[0] = local_568._0_8_;
  (*palVar1)[1] = local_568._8_8_;
  (*palVar1)[2] = local_568._16_8_;
  (*palVar1)[3] = local_568._24_8_;
  palVar1 = output + outstride * 0x10;
  (*palVar1)[0] = local_238._0_8_;
  (*palVar1)[1] = local_238._8_8_;
  (*palVar1)[2] = local_238._16_8_;
  (*palVar1)[3] = local_238._24_8_;
  return;
}

Assistant:

static inline void fdct32_avx2(const __m256i *input, __m256i *output,
                               int8_t cos_bit) {
  __m256i x1[32];
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));
  // stage 0
  // stage 1
  btf_32_add_sub_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_32_add_sub_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_32_add_sub_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_32_add_sub_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_32_add_sub_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_32_add_sub_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_32_add_sub_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_32_add_sub_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_32_add_sub_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_32_add_sub_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_32_add_sub_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_32_add_sub_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_32_add_sub_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_32_add_sub_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_32_add_sub_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_32_add_sub_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_32_add_sub_avx2(&x1[0], &x1[15]);
  btf_32_add_sub_avx2(&x1[1], &x1[14]);
  btf_32_add_sub_avx2(&x1[2], &x1[13]);
  btf_32_add_sub_avx2(&x1[3], &x1[12]);
  btf_32_add_sub_avx2(&x1[4], &x1[11]);
  btf_32_add_sub_avx2(&x1[5], &x1[10]);
  btf_32_add_sub_avx2(&x1[6], &x1[9]);
  btf_32_add_sub_avx2(&x1[7], &x1[8]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_32_add_sub_avx2(&x1[0], &x1[7]);
  btf_32_add_sub_avx2(&x1[1], &x1[6]);
  btf_32_add_sub_avx2(&x1[2], &x1[5]);
  btf_32_add_sub_avx2(&x1[3], &x1[4]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[23]);
  btf_32_add_sub_avx2(&x1[17], &x1[22]);
  btf_32_add_sub_avx2(&x1[18], &x1[21]);
  btf_32_add_sub_avx2(&x1[19], &x1[20]);
  btf_32_add_sub_avx2(&x1[31], &x1[24]);
  btf_32_add_sub_avx2(&x1[30], &x1[25]);
  btf_32_add_sub_avx2(&x1[29], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_32_add_sub_avx2(&x1[0], &x1[3]);
  btf_32_add_sub_avx2(&x1[1], &x1[2]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[11]);
  btf_32_add_sub_avx2(&x1[9], &x1[10]);
  btf_32_add_sub_avx2(&x1[15], &x1[12]);
  btf_32_add_sub_avx2(&x1[14], &x1[13]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_32_avx2_type0(cospi[32], cospi[32], &x1[0], &x1[1], _r, cos_bit);
  btf_32_avx2_type1(cospi[48], cospi[16], &x1[2], &x1[3], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[4], &x1[5]);
  btf_32_add_sub_avx2(&x1[7], &x1[6]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[10], &x1[13], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[19]);
  btf_32_add_sub_avx2(&x1[17], &x1[18]);
  btf_32_add_sub_avx2(&x1[23], &x1[20]);
  btf_32_add_sub_avx2(&x1[22], &x1[21]);
  btf_32_add_sub_avx2(&x1[24], &x1[27]);
  btf_32_add_sub_avx2(&x1[25], &x1[26]);
  btf_32_add_sub_avx2(&x1[31], &x1[28]);
  btf_32_add_sub_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_32_avx2_type1(cospi[56], cospi[8], &x1[4], &x1[7], _r, cos_bit);
  btf_32_avx2_type1(cospi[24], cospi[40], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[9]);
  btf_32_add_sub_avx2(&x1[11], &x1[10]);
  btf_32_add_sub_avx2(&x1[12], &x1[13]);
  btf_32_add_sub_avx2(&x1[15], &x1[14]);
  btf_32_avx2_type0(-cospi[8], cospi[56], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type0(-cospi[56], -cospi[8], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[40], cospi[24], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[24], -cospi[40], &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_32_avx2_type1(cospi[60], cospi[4], &x1[8], &x1[15], _r, cos_bit);
  btf_32_avx2_type1(cospi[28], cospi[36], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type1(cospi[44], cospi[20], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type1(cospi[12], cospi[52], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[17]);
  btf_32_add_sub_avx2(&x1[19], &x1[18]);
  btf_32_add_sub_avx2(&x1[20], &x1[21]);
  btf_32_add_sub_avx2(&x1[23], &x1[22]);
  btf_32_add_sub_avx2(&x1[24], &x1[25]);
  btf_32_add_sub_avx2(&x1[27], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[29]);
  btf_32_add_sub_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_32_avx2_type1(cospi[62], cospi[2], &x1[16], &x1[31], _r, cos_bit);
  btf_32_avx2_type1(cospi[30], cospi[34], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type1(cospi[46], cospi[18], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type1(cospi[14], cospi[50], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type1(cospi[54], cospi[10], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type1(cospi[22], cospi[42], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type1(cospi[38], cospi[26], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type1(cospi[6], cospi[58], &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}